

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int parse_expression_list(ParserState *parser,AstNodeList **list)

{
  LexerState *ls;
  int iVar1;
  AstNode *pAVar2;
  BinaryOperatorType ignored;
  BinaryOperatorType ignored_1;
  BinaryOperatorType BStack_28;
  BinaryOperatorType local_24;
  void **ppvVar3;
  
  ls = parser->ls;
  pAVar2 = parse_sub_expression(parser,0,&BStack_28);
  ppvVar3 = raviX_ptrlist_add((PtrList **)list,pAVar2,parser->compiler_state->allocator);
  iVar1 = (int)ppvVar3;
  if ((ls->t).token == 0x2c) {
    do {
      raviX_next(ls);
      pAVar2 = parse_sub_expression(parser,0,&local_24);
      ppvVar3 = raviX_ptrlist_add((PtrList **)list,pAVar2,parser->compiler_state->allocator);
      iVar1 = (int)ppvVar3;
    } while ((ls->t).token == 0x2c);
  }
  return iVar1;
}

Assistant:

static int parse_expression_list(ParserState *parser, AstNodeList **list)
{
	LexerState *ls = parser->ls;
	/* explist -> expr { ',' expr } */
	int n = 1; /* at least one expression */
	AstNode *expr = parse_expression(parser);
	add_ast_node(parser->compiler_state, list, expr);
	while (testnext(ls, ',')) {
		expr = parse_expression(parser);
		add_ast_node(parser->compiler_state, list, expr);
		n++;
	}
	return n;
}